

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSat3.c
# Opt level: O2

int Gia_ManSat3CallOne(Gia_Man_t *p,int iOutput)

{
  int status;
  abctime aVar1;
  sat_solver3 *s;
  abctime aVar2;
  int iVar3;
  
  aVar1 = Abc_Clock();
  s = Gia_ManSat3Create(p);
  if (s == (sat_solver3 *)0x0) {
    iVar3 = 0;
    status = -1;
  }
  else {
    status = sat_solver3_solve(s,(lit *)0x0,(lit *)0x0,0,0,0,0);
    iVar3 = (int)(s->stats).conflicts;
    sat_solver3_delete(s);
  }
  aVar2 = Abc_Clock();
  Gia_ManSat3Report(iOutput,status,aVar2 - aVar1);
  return iVar3;
}

Assistant:

int Gia_ManSat3CallOne( Gia_Man_t * p, int iOutput )
{
    abctime clk = Abc_Clock();
    sat_solver3 * pSat;
    int status, Cost = 0;

    pSat = Gia_ManSat3Create( p );
    if ( pSat )
    {
        status = sat_solver3_solve( pSat, NULL, NULL, 0, 0, 0, 0 );
        Cost = (unsigned)pSat->stats.conflicts;
        sat_solver3_delete( pSat );
    }
    else 
        status = l_False;

    Gia_ManSat3Report( iOutput, status, Abc_Clock() - clk );
    return Cost;
}